

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::
     handle_char_specs<char,fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_spec_handler>
               (basic_format_specs<char> *specs,char_spec_handler *handler)

{
  char cVar1;
  bool bVar2;
  alignment aVar3;
  char_spec_handler *handler_local;
  basic_format_specs<char> *specs_local;
  
  cVar1 = basic_format_specs<char>::type(specs);
  if ((cVar1 != '\0') && (cVar1 = basic_format_specs<char>::type(specs), cVar1 != 'c')) {
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    char_spec_handler::on_int(handler);
    return;
  }
  aVar3 = align_spec::align(&specs->super_align_spec);
  if ((aVar3 == ALIGN_NUMERIC) || (bVar2 = basic_format_specs<char>::flag(specs,0xffffffff), bVar2))
  {
    error_handler::on_error((error_handler *)handler,"invalid format specifier for char");
  }
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  char_spec_handler::on_char(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_char_specs(
    const basic_format_specs<Char> &specs, Handler &&handler) {
  if (specs.type() && specs.type() != 'c') {
    handler.on_int();
    return;
  }
  if (specs.align() == ALIGN_NUMERIC || specs.flag(~0u) != 0)
    handler.on_error("invalid format specifier for char");
  handler.on_char();
}